

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directory.cpp
# Opt level: O1

string * Corrade::Utility::Directory::current_abi_cxx11_(void)

{
  bool bVar1;
  String *other;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_type *psVar3;
  string *in_RDI;
  Optional<Corrade::Containers::String> out;
  Optional<Corrade::Containers::String> OStack_58;
  string local_38;
  
  Path::currentDirectory();
  bVar1 = OStack_58._set;
  if (OStack_58._set == true) {
    other = Containers::Optional<Corrade::Containers::String>::operator*(&OStack_58);
    Containers::Implementation::
    StringConverter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::to(&local_38,other);
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    paVar2 = &local_38.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == paVar2) {
      (in_RDI->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_38.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_38._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    }
    psVar3 = &local_38._M_string_length;
    in_RDI->_M_string_length = local_38._M_string_length;
    local_38._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    paVar2 = &in_RDI->field_2;
    (in_RDI->_M_dataplus)._M_p = (pointer)paVar2;
    psVar3 = &in_RDI->_M_string_length;
  }
  *psVar3 = 0;
  paVar2->_M_local_buf[0] = '\0';
  if ((bVar1 != false) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2)) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (OStack_58._set == true) {
    Containers::String::~String((String *)&OStack_58);
  }
  return in_RDI;
}

Assistant:

std::string current() {
    Containers::Optional<Containers::String> out = Path::currentDirectory();
    return out ? std::string{*out} : std::string{};
}